

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + s->_M_string_length)
  ;
  if (3 < local_68) {
    iVar3 = strcmp((char *)((long)local_70 + (local_68 - 4)),"/bin");
    if (iVar3 == 0) {
      bVar4 = true;
      goto LAB_003cfc68;
    }
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + s->_M_string_length)
  ;
  plVar2 = local_50;
  if (local_48 < 5) {
    bVar4 = false;
  }
  else {
    iVar3 = strcmp((char *)((long)local_50 + (local_48 - 5)),"/sbin");
    bVar4 = iVar3 == 0;
  }
  if (plVar2 != local_40) {
    operator_delete(plVar2,local_40[0] + 1);
  }
LAB_003cfc68:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (bVar4) {
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if((cmHasLiteralSuffix(s, "/bin")) ||
     (cmHasLiteralSuffix(s, "/sbin")))
    {
    return cmSystemTools::GetFilenamePath(s);
    }
  else
    {
    return s;
    }
}